

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.hpp
# Opt level: O0

void __thiscall
Args::OnlyOneGroup::checkCorrectnessBeforeParsing
          (OnlyOneGroup *this,StringList *flags,StringList *names)

{
  bool bVar1;
  uint uVar2;
  Arguments *t;
  pointer pAVar3;
  char *__rhs;
  GroupIface *in_RDI;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  const_iterator __end2;
  const_iterator __begin2;
  type *__range2;
  GroupIface *in_stack_fffffffffffffea8;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  *in_stack_fffffffffffffeb0;
  allocator *__lhs;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  GroupIface *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  undefined1 local_110 [55];
  allocator local_d9;
  string local_d8 [160];
  reference local_38;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_30;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  local_28;
  type *local_20;
  
  GroupIface::checkCorrectnessBeforeParsing
            (in_stack_fffffffffffffed0,
             (StringList *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
             (StringList *)in_RDI);
  t = GroupIface::children(in_RDI);
  local_20 = details::
             asConst<std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>const>
                       (t);
  local_28._M_current =
       (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
       std::
       vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
       ::begin((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                *)in_stack_fffffffffffffea8);
  local_30 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ::end((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                    *)in_stack_fffffffffffffea8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffeb0,
                       (__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar1) {
      return;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
               ::operator*(&local_28);
    pAVar3 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                       ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                        0x168695);
    uVar2 = (*pAVar3->_vptr_ArgIface[5])();
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
    ::operator++(&local_28);
  }
  __rhs = (char *)__cxa_allocate_exception(0x30);
  __lhs = &local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Required argument \"",__lhs);
  pAVar3 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                     ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                      0x1686f2);
  (*pAVar3->_vptr_ArgIface[3])(local_110);
  std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  GroupIface::name_abi_cxx11_(in_stack_fffffffffffffea8);
  std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  BaseException::BaseException((BaseException *)in_RDI,(String *)__lhs);
  __cxa_throw(__rhs,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

void checkCorrectnessBeforeParsing(
		//! All known flags.
		StringList & flags,
		//! All known names.
		StringList & names ) const override
	{
		GroupIface::checkCorrectnessBeforeParsing( flags, names );

		for( const auto & arg : details::asConst( children() ) )
		{
			if( arg->isRequired() )
				throw BaseException( String( SL( "Required argument \"" ) ) +
					arg->name() +
					SL( "\" is not allowed to be in OnlyOne group \"" ) +
					name() + SL( "\"." ) );
		}
	}